

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insertproxymodel.cpp
# Opt level: O3

bool __thiscall
InsertProxyModel::moveRows
          (InsertProxyModel *this,QModelIndex *sourceParent,int sourceRow,int count,
          QModelIndex *destinationParent,int destinationChild)

{
  undefined1 uVar1;
  int iVar2;
  long lVar3;
  long *plVar4;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  if (((((sourceParent->r < 0) || (sourceParent->c < 0)) ||
       (sourceParent->m == (QAbstractItemModel *)0x0)) &&
      (((destinationParent->r < 0 || (destinationParent->c < 0)) ||
       (destinationParent->m == (QAbstractItemModel *)0x0)))) &&
     (lVar3 = QAbstractProxyModel::sourceModel(), lVar3 != 0)) {
    plVar4 = (long *)QAbstractProxyModel::sourceModel();
    local_58 = 0xffffffffffffffff;
    local_50 = 0;
    uStack_48 = 0;
    iVar2 = (**(code **)(*plVar4 + 0x78))(plVar4);
    if (count + sourceRow <= iVar2) {
      plVar4 = (long *)QAbstractProxyModel::sourceModel();
      local_58 = 0xffffffffffffffff;
      local_50 = 0;
      uStack_48 = 0;
      iVar2 = (**(code **)(*plVar4 + 0x78))(plVar4);
      if (destinationChild <= iVar2) {
        plVar4 = (long *)QAbstractProxyModel::sourceModel();
        local_58 = 0xffffffffffffffff;
        local_50 = 0;
        uStack_48 = 0;
        local_40 = 0xffffffffffffffff;
        local_38 = 0;
        uStack_30 = 0;
        uVar1 = (**(code **)(*plVar4 + 0x118))
                          (plVar4,&local_58,sourceRow,count,&local_40,destinationChild);
        return (bool)uVar1;
      }
    }
  }
  return false;
}

Assistant:

bool InsertProxyModel::moveRows(const QModelIndex &sourceParent, int sourceRow, int count, const QModelIndex &destinationParent, int destinationChild)
{
    if (sourceParent.isValid() || destinationParent.isValid())
        return false;
    if (!sourceModel())
        return false;
    if (sourceRow + count > sourceModel()->rowCount())
        return false;
    if (destinationChild > sourceModel()->rowCount())
        return false;
    return sourceModel()->moveRows(QModelIndex(), sourceRow, count, QModelIndex(), destinationChild);
}